

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O3

void __thiscall OpenMD::SC::calcDensity(SC *this,InteractionData *idat)

{
  double dVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  RealType RVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)piVar2[idat->atid2];
  lVar3 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar2[idat->atid1]].
                    super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  dVar1 = *(double *)(lVar3 + 0x20 + lVar4 * 0x48);
  if (idat->rij <= dVar1 && dVar1 != idat->rij) {
    RVar5 = CubicSpline::getValueAt(*(CubicSpline **)(lVar3 + lVar4 * 0x48 + 0x38),&idat->rij);
    idat->rho1 = RVar5 + idat->rho1;
    idat->rho2 = RVar5 + idat->rho2;
  }
  return;
}

Assistant:

void SC::calcDensity(InteractionData& idat) {
    if (!initialized_) initialize();
    int sctid1 = SCtids[idat.atid1];
    int sctid2 = SCtids[idat.atid2];

    SCInteractionData& mixer = MixingMap[sctid1][sctid2];

    RealType rcij = mixer.rCut;

    if (idat.rij < rcij) {
      RealType rho = mixer.phi->getValueAt(idat.rij);
      idat.rho1 += rho;
      idat.rho2 += rho;
    }

    return;
  }